

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O0

void realize_virt_arrays(j_common_ptr cinfo)

{
  jpeg_error_mgr *pjVar1;
  JBLOCKARRAY ppaJVar2;
  j_common_ptr in_RDI;
  jvirt_barray_ptr bptr;
  jvirt_sarray_ptr sptr;
  long max_minheights;
  long minheights;
  long avail_mem;
  long maximum_space;
  long space_per_minheight;
  my_mem_ptr mem;
  backing_store_ptr pbVar3;
  _func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *p_Var4;
  jpeg_memory_mgr *cinfo_00;
  j_common_ptr cinfo_01;
  long local_38;
  long local_20;
  long local_18;
  jpeg_memory_mgr *pjVar5;
  
  pjVar5 = in_RDI->mem;
  local_18 = 0;
  local_20 = 0;
  for (p_Var4 = pjVar5[1].request_virt_sarray;
      p_Var4 != (_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *)
                0x0;
      p_Var4 = *(_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION **
                )(p_Var4 + 0x30)) {
    if (*(long *)p_Var4 == 0) {
      local_18 = (ulong)*(uint *)(p_Var4 + 0x10) * (ulong)*(uint *)(p_Var4 + 0xc) + local_18;
      local_20 = (ulong)*(uint *)(p_Var4 + 8) * (ulong)*(uint *)(p_Var4 + 0xc) + local_20;
    }
  }
  for (pbVar3 = (backing_store_ptr)pjVar5[1].request_virt_barray; pbVar3 != (backing_store_ptr)0x0;
      pbVar3 = *(backing_store_ptr *)(pbVar3->temp_name + 0x10)) {
    if (pbVar3->read_backing_store ==
        (_func_void_j_common_ptr_backing_store_ptr_void_ptr_long_long *)0x0) {
      local_18 = (ulong)*(uint *)&pbVar3->close_backing_store *
                 (ulong)*(uint *)((long)&pbVar3->write_backing_store + 4) * 0x80 + local_18;
      local_20 = (ulong)*(uint *)&pbVar3->write_backing_store *
                 (ulong)*(uint *)((long)&pbVar3->write_backing_store + 4) * 0x80 + local_20;
    }
  }
  if (0 < local_18) {
    local_38 = jpeg_mem_available(in_RDI,local_18,local_20,(long)pjVar5[1].realize_virt_arrays);
    if (local_38 < local_20) {
      local_38 = local_38 / local_18;
      if (local_38 < 1) {
        local_38 = 1;
      }
    }
    else {
      local_38 = 1000000000;
    }
    for (cinfo_00 = (jpeg_memory_mgr *)pjVar5[1].request_virt_sarray;
        cinfo_00 != (jpeg_memory_mgr *)0x0;
        cinfo_00 = (jpeg_memory_mgr *)((j_common_ptr)&cinfo_00->realize_virt_arrays)->err) {
      if (cinfo_00->alloc_small == (_func_void_ptr_j_common_ptr_int_size_t *)0x0) {
        if (local_38 <
            (long)((ulong)*(uint *)&cinfo_00->alloc_large - 1) /
            (long)(ulong)*(uint *)&cinfo_00->alloc_sarray + 1) {
          *(int *)((long)&cinfo_00->alloc_sarray + 4) =
               (int)local_38 * *(int *)&cinfo_00->alloc_sarray;
          jpeg_open_backing_store((j_common_ptr)cinfo_00,pbVar3,0x119335);
          *(undefined4 *)((long)&((j_common_ptr)&cinfo_00->request_virt_barray)->err + 4) = 1;
        }
        else {
          *(undefined4 *)((long)&cinfo_00->alloc_sarray + 4) = *(undefined4 *)&cinfo_00->alloc_large
          ;
        }
        pjVar1 = (jpeg_error_mgr *)
                 alloc_sarray((j_common_ptr)bptr,(int)((ulong)in_RDI >> 0x20),(JDIMENSION)in_RDI,
                              (JDIMENSION)((ulong)pjVar5 >> 0x20));
        cinfo_00->alloc_small = (_func_void_ptr_j_common_ptr_int_size_t *)pjVar1;
        *(undefined4 *)&cinfo_00->alloc_barray = *(undefined4 *)&pjVar5[1].access_virt_sarray;
        *(undefined4 *)((long)&cinfo_00->alloc_barray + 4) = 0;
        *(boolean *)&cinfo_00->request_virt_sarray = 0;
        *(undefined4 *)&((j_common_ptr)&cinfo_00->request_virt_barray)->err = 0;
      }
    }
    cinfo_01 = (j_common_ptr)0x0;
    for (pbVar3 = (backing_store_ptr)pjVar5[1].request_virt_barray; pbVar3 != (backing_store_ptr)0x0
        ; pbVar3 = *(backing_store_ptr *)(pbVar3->temp_name + 0x10)) {
      if (pbVar3->read_backing_store ==
          (_func_void_j_common_ptr_backing_store_ptr_void_ptr_long_long *)0x0) {
        if (local_38 <
            (long)((ulong)*(uint *)&pbVar3->write_backing_store - 1) /
            (long)(ulong)*(uint *)&pbVar3->close_backing_store + 1) {
          *(int *)((long)&pbVar3->close_backing_store + 4) =
               (int)local_38 * *(int *)&pbVar3->close_backing_store;
          jpeg_open_backing_store(cinfo_01,pbVar3,0x11945f);
          pbVar3->temp_name[0xc] = '\x01';
          pbVar3->temp_name[0xd] = '\0';
          pbVar3->temp_name[0xe] = '\0';
          pbVar3->temp_name[0xf] = '\0';
        }
        else {
          *(undefined4 *)((long)&pbVar3->close_backing_store + 4) =
               *(undefined4 *)&pbVar3->write_backing_store;
        }
        ppaJVar2 = alloc_barray((j_common_ptr)bptr,(int)((ulong)in_RDI >> 0x20),(JDIMENSION)in_RDI,
                                (JDIMENSION)((ulong)pjVar5 >> 0x20));
        pbVar3->read_backing_store =
             (_func_void_j_common_ptr_backing_store_ptr_void_ptr_long_long *)ppaJVar2;
        *(undefined4 *)&pbVar3->temp_file = *(undefined4 *)&pjVar5[1].access_virt_sarray;
        *(undefined4 *)((long)&pbVar3->temp_file + 4) = 0;
        pbVar3->temp_name[0] = '\0';
        pbVar3->temp_name[1] = '\0';
        pbVar3->temp_name[2] = '\0';
        pbVar3->temp_name[3] = '\0';
        pbVar3->temp_name[8] = '\0';
        pbVar3->temp_name[9] = '\0';
        pbVar3->temp_name[10] = '\0';
        pbVar3->temp_name[0xb] = '\0';
      }
    }
  }
  return;
}

Assistant:

METHODDEF(void)
realize_virt_arrays (j_common_ptr cinfo)
/* Allocate the in-memory buffers for any unrealized virtual arrays */
{
  my_mem_ptr mem = (my_mem_ptr) cinfo->mem;
  long space_per_minheight, maximum_space, avail_mem;
  long minheights, max_minheights;
  jvirt_sarray_ptr sptr;
  jvirt_barray_ptr bptr;

  /* Compute the minimum space needed (maxaccess rows in each buffer)
   * and the maximum space needed (full image height in each buffer).
   * These may be of use to the system-dependent jpeg_mem_available routine.
   */
  space_per_minheight = 0;
  maximum_space = 0;
  for (sptr = mem->virt_sarray_list; sptr != NULL; sptr = sptr->next) {
    if (sptr->mem_buffer == NULL) { /* if not realized yet */
      space_per_minheight += (long) sptr->maxaccess *
			     (long) sptr->samplesperrow * SIZEOF(JSAMPLE);
      maximum_space += (long) sptr->rows_in_array *
		       (long) sptr->samplesperrow * SIZEOF(JSAMPLE);
    }
  }
  for (bptr = mem->virt_barray_list; bptr != NULL; bptr = bptr->next) {
    if (bptr->mem_buffer == NULL) { /* if not realized yet */
      space_per_minheight += (long) bptr->maxaccess *
			     (long) bptr->blocksperrow * SIZEOF(JBLOCK);
      maximum_space += (long) bptr->rows_in_array *
		       (long) bptr->blocksperrow * SIZEOF(JBLOCK);
    }
  }

  if (space_per_minheight <= 0)
    return;			/* no unrealized arrays, no work */

  /* Determine amount of memory to actually use; this is system-dependent. */
  avail_mem = jpeg_mem_available(cinfo, space_per_minheight, maximum_space,
				 mem->total_space_allocated);

  /* If the maximum space needed is available, make all the buffers full
   * height; otherwise parcel it out with the same number of minheights
   * in each buffer.
   */
  if (avail_mem >= maximum_space)
    max_minheights = 1000000000L;
  else {
    max_minheights = avail_mem / space_per_minheight;
    /* If there doesn't seem to be enough space, try to get the minimum
     * anyway.  This allows a "stub" implementation of jpeg_mem_available().
     */
    if (max_minheights <= 0)
      max_minheights = 1;
  }

  /* Allocate the in-memory buffers and initialize backing store as needed. */

  for (sptr = mem->virt_sarray_list; sptr != NULL; sptr = sptr->next) {
    if (sptr->mem_buffer == NULL) { /* if not realized yet */
      minheights = ((long) sptr->rows_in_array - 1L) / sptr->maxaccess + 1L;
      if (minheights <= max_minheights) {
	/* This buffer fits in memory */
	sptr->rows_in_mem = sptr->rows_in_array;
      } else {
	/* It doesn't fit in memory, create backing store. */
	sptr->rows_in_mem = (JDIMENSION) (max_minheights * sptr->maxaccess);
	jpeg_open_backing_store(cinfo, & sptr->b_s_info,
				(long) sptr->rows_in_array *
				(long) sptr->samplesperrow *
				(long) SIZEOF(JSAMPLE));
	sptr->b_s_open = TRUE;
      }
      sptr->mem_buffer = alloc_sarray(cinfo, JPOOL_IMAGE,
				      sptr->samplesperrow, sptr->rows_in_mem);
      sptr->rowsperchunk = mem->last_rowsperchunk;
      sptr->cur_start_row = 0;
      sptr->first_undef_row = 0;
      sptr->dirty = FALSE;
    }
  }

  for (bptr = mem->virt_barray_list; bptr != NULL; bptr = bptr->next) {
    if (bptr->mem_buffer == NULL) { /* if not realized yet */
      minheights = ((long) bptr->rows_in_array - 1L) / bptr->maxaccess + 1L;
      if (minheights <= max_minheights) {
	/* This buffer fits in memory */
	bptr->rows_in_mem = bptr->rows_in_array;
      } else {
	/* It doesn't fit in memory, create backing store. */
	bptr->rows_in_mem = (JDIMENSION) (max_minheights * bptr->maxaccess);
	jpeg_open_backing_store(cinfo, & bptr->b_s_info,
				(long) bptr->rows_in_array *
				(long) bptr->blocksperrow *
				(long) SIZEOF(JBLOCK));
	bptr->b_s_open = TRUE;
      }
      bptr->mem_buffer = alloc_barray(cinfo, JPOOL_IMAGE,
				      bptr->blocksperrow, bptr->rows_in_mem);
      bptr->rowsperchunk = mem->last_rowsperchunk;
      bptr->cur_start_row = 0;
      bptr->first_undef_row = 0;
      bptr->dirty = FALSE;
    }
  }
}